

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammaticalAnalyzer.cpp
# Opt level: O0

void __thiscall
LLGrammaticalAnalyzer::AnalyzeToken
          (LLGrammaticalAnalyzer *this,vector<quadraple,_std::allocator<quadraple>_> *token)

{
  int iVar1;
  bool bVar2;
  __type_conflict _Var3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  mapped_type_conflict1 *pmVar9;
  ostream *poVar10;
  reference pvVar11;
  reference pbVar12;
  reference pvVar13;
  undefined1 local_1a8 [8];
  string r;
  string local_180 [4];
  int j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tt;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  iterator iStack_140;
  int pr;
  _Self local_138;
  undefined1 local_130 [8];
  string stritem;
  string tp;
  undefined1 local_e8 [8];
  quadraple item;
  int i;
  allocator local_89;
  value_type local_88;
  undefined1 local_68 [8];
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  S;
  vector<quadraple,_std::allocator<quadraple>_> *token_local;
  LLGrammaticalAnalyzer *this_local;
  
  S.c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)token;
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"program",&local_89);
  std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  item.linenumber = 0;
  do {
    uVar4 = (ulong)item.linenumber;
    sVar5 = std::vector<quadraple,_std::allocator<quadraple>_>::size
                      ((vector<quadraple,_std::allocator<quadraple>_> *)
                       S.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (sVar5 <= uVar4) break;
    pvVar6 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                       ((vector<quadraple,_std::allocator<quadraple>_> *)
                        S.c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)item.linenumber);
    quadraple::quadraple((quadraple *)local_e8,pvVar6);
    bVar2 = std::
            stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_68);
    if (bVar2) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Error");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      tp.field_2._12_4_ = 2;
    }
    else {
      pvVar7 = std::
               stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::top((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_68);
      std::__cxx11::string::string((string *)(stritem.field_2._M_local_buf + 8),(string *)pvVar7);
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_68);
      std::__cxx11::string::string((string *)local_130);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e8,"real");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)local_130,"REALNUM");
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_e8,"int");
        if (bVar2) {
          std::__cxx11::string::operator=((string *)local_130,"INTNUM");
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e8,"identifier");
          if (bVar2) {
            std::__cxx11::string::operator=((string *)local_130,"ID");
          }
          else {
            pvVar6 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[]
                               ((vector<quadraple,_std::allocator<quadraple>_> *)
                                S.c.
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node,
                                (long)item.linenumber);
            std::__cxx11::string::operator=((string *)local_130,(string *)&pvVar6->attributevalue);
          }
        }
      }
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_130,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&stritem.field_2 + 8));
      if (_Var3) {
        item.linenumber = item.linenumber + 1;
        tp.field_2._12_4_ = 3;
      }
      else {
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
                 ::operator[](&this->TABLE,(key_type *)((long)&stritem.field_2 + 8));
        local_138._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(pmVar8,(key_type *)local_130);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
                 ::operator[](&this->TABLE,(key_type *)((long)&stritem.field_2 + 8));
        iStack_140 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::end(pmVar8);
        bVar2 = std::operator==(&local_138,&stack0xfffffffffffffec0);
        if (bVar2) {
          poVar10 = std::operator<<((ostream *)&std::cout,"error");
          poVar10 = std::operator<<(poVar10," ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,item.attributevalue.field_2._8_4_);
          poVar10 = std::operator<<(poVar10," ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,item.attributevalue.field_2._12_4_);
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          tp.field_2._12_4_ = 2;
        }
        else {
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>_>
                   ::operator[](&this->TABLE,(key_type *)((long)&stritem.field_2 + 8));
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](pmVar8,(key_type *)local_130);
          iVar1 = *pmVar9;
          if (iVar1 == -1) {
            poVar10 = std::operator<<((ostream *)&std::cout,"error");
            poVar10 = std::operator<<(poVar10," ");
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,item.attributevalue.field_2._8_4_)
            ;
            poVar10 = std::operator<<(poVar10," ");
            poVar10 = (ostream *)
                      std::ostream::operator<<(poVar10,item.attributevalue.field_2._12_4_);
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            tp.field_2._12_4_ = 2;
          }
          else {
            pvVar11 = std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&this->VectorP,(long)iVar1);
            poVar10 = std::operator<<((ostream *)&std::cout,(string *)pvVar11);
            std::operator<<(poVar10,"->");
            pvVar11 = std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&this->VectorP,(long)iVar1);
            __end4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&pvVar11->second);
            tt.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&pvVar11->second);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)((long)&tt.field_2 + 8)), bVar2) {
              pbVar12 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end4);
              std::__cxx11::string::string(local_180,(string *)pbVar12);
              poVar10 = std::operator<<((ostream *)&std::cout,local_180);
              std::operator<<(poVar10,' ');
              std::__cxx11::string::~string(local_180);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end4);
            }
            std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
            pvVar11 = std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&this->VectorP,(long)iVar1);
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&pvVar11->second);
            r.field_2._12_4_ = (undefined4)sVar5;
            while (r.field_2._12_4_ = r.field_2._12_4_ + -1, -1 < (int)r.field_2._12_4_) {
              pvVar11 = std::
                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[](&this->VectorP,(long)iVar1);
              pvVar13 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](&pvVar11->second,(long)(int)r.field_2._12_4_);
              std::__cxx11::string::string((string *)local_1a8,(string *)pvVar13);
              bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1a8,"#");
              if (bVar2) {
                std::
                stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_68,(value_type *)local_1a8);
              }
              std::__cxx11::string::~string((string *)local_1a8);
            }
            tp.field_2._12_4_ = 0;
          }
        }
      }
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)(stritem.field_2._M_local_buf + 8));
    }
    quadraple::~quadraple((quadraple *)local_e8);
  } while ((tp.field_2._12_4_ == 0) || (tp.field_2._12_4_ != 2));
  bVar2 = std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_68);
  if (bVar2) {
    poVar10 = std::operator<<((ostream *)&std::cout,"No Grammatical Error.");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  std::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_68);
  return;
}

Assistant:

void LLGrammaticalAnalyzer::AnalyzeToken(std::vector<quadraple> &token) {
    std::stack<std::string> S;
    S.push("program");
    for (int i = 0; i < token.size();) {
        quadraple item = token[i];
        if (S.empty()) {
            std::cout << "Error" << std::endl;
            break;
        }
        std::string tp = S.top();
        S.pop();
        std::string stritem;
        if (item.tokentype == "real") stritem = "REALNUM";
        else if (item.tokentype == "int") stritem = "INTNUM";
        else if (item.tokentype == "identifier") stritem = "ID";
        else stritem = token[i].attributevalue;
        if (stritem == tp) {
            ++i;
            continue;
        } else {
            if (TABLE[tp].find(stritem) == TABLE[tp].end()) {
                std::cout << "error" << " " << item.linenumber << " " << item.lineposition << std::endl;
                break;
            }
            int pr = TABLE[tp][stritem];
            if (pr == -1) {
                std::cout << "error" << " " << item.linenumber << " " << item.lineposition << std::endl;
                break;
            } else {
                //std::cout << pr <<std::endl;
                std::cout << VectorP[pr].first << "->";
                for (auto tt : VectorP[pr].second) {
                    std::cout << tt << ' ';
                }
                std::cout << std::endl;
                for (int j = VectorP[pr].second.size() - 1; j >= 0; j--) {
                    std::string r = VectorP[pr].second[j];
                    if (r != "#") {
                        S.push(r);
                    }
                }
            }
        }
    }
    if (S.empty()) {
        std::cout << "No Grammatical Error." << std::endl;
    }
}